

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall TArray<vertex_t,_vertex_t>::Resize(TArray<vertex_t,_vertex_t> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  vertex_t *pvVar3;
  ulong uVar4;
  long lVar5;
  uint amount_00;
  
  uVar2 = this->Count;
  amount_00 = amount - uVar2;
  if (amount < uVar2 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar2 - 1);
    }
  }
  else {
    Grow(this,amount_00);
    uVar4 = (ulong)this->Count;
    lVar5 = uVar4 * 0x38 + 0x28;
    for (; uVar4 < amount; uVar4 = uVar4 + 1) {
      pvVar3 = this->Array;
      puVar1 = (undefined8 *)((long)pvVar3 + lVar5 + -0x28);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pvVar3 + lVar5 + -0x18) = 0;
      *(undefined1 *)((long)pvVar3 + lVar5 + -0x10) = 1;
      *(undefined8 *)((long)pvVar3 + lVar5 + -0xc) = 0;
      puVar1 = (undefined8 *)((long)&(pvVar3->p).X + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar5 = lVar5 + 0x38;
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}